

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall
nvim::Nvim::async_tabpage_set_var(Nvim *this,Tabpage tabpage,string *name,Object *value)

{
  allocator local_49;
  string local_48;
  Object *local_28;
  Object *value_local;
  string *name_local;
  Tabpage tabpage_local;
  Nvim *this_local;
  
  local_28 = value;
  value_local = (Object *)name;
  name_local = (string *)tabpage;
  tabpage_local = (Tabpage)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"nvim_tabpage_set_var",&local_49);
  NvimRPC::
  async_call<long,std::__cxx11::string,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
            (&this->client_,&local_48,(long *)&name_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_local,
             local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void Nvim::async_tabpage_set_var(Tabpage tabpage, const std::string& name, const Object& value) {
    client_.async_call("nvim_tabpage_set_var", tabpage, name, value);
}